

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void swrenderer::R_DrawColumnHoriz(void)

{
  long *plVar1;
  uint **span;
  int x;
  
  if (0 < drawerargs::dc_count) {
    plVar1 = (long *)(drawerargs::dc_ctspan + (long)(int)(drawerargs::dc_x & 3) * 8);
    *(undefined4 *)*plVar1 = drawerargs::dc_yl;
    *(undefined4 *)(*plVar1 + 4) = drawerargs::dc_yh;
    *plVar1 = *plVar1 + 8;
    DrawerCommandQueue::QueueCommand<swrenderer::DrawColumnHorizPalCommand>();
  }
  return;
}

Assistant:

void R_DrawColumnHoriz()
	{
		using namespace drawerargs;

		if (dc_count <= 0)
			return;

		int x = dc_x & 3;
		unsigned int **span = &dc_ctspan[x];
		(*span)[0] = dc_yl;
		(*span)[1] = dc_yh;
		*span += 2;

		DrawerCommandQueue::QueueCommand<DrawColumnHorizPalCommand>();
	}